

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryLight(aiLight *l)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  aiLightSourceType local_2c;
  
  ofs = WriteMagic(0x1235);
  uVar1 = Write<aiString>(&l->mName);
  local_2c = l->mType;
  uVar2 = Write<unsigned_int>(&local_2c);
  iVar4 = uVar2 + uVar1;
  if (l->mType != aiLightSource_DIRECTIONAL) {
    uVar1 = Write<float>(&l->mAttenuationConstant);
    uVar2 = Write<float>(&l->mAttenuationLinear);
    uVar3 = Write<float>(&l->mAttenuationQuadratic);
    iVar4 = uVar3 + uVar2 + uVar1 + iVar4;
  }
  uVar1 = Write<aiColor3D>(&l->mColorDiffuse);
  uVar2 = Write<aiColor3D>(&l->mColorSpecular);
  uVar3 = Write<aiColor3D>(&l->mColorAmbient);
  uVar3 = uVar3 + uVar2 + uVar1 + iVar4;
  if (l->mType == aiLightSource_SPOT) {
    uVar1 = Write<float>(&l->mAngleInnerCone);
    uVar2 = Write<float>(&l->mAngleOuterCone);
    uVar3 = uVar3 + uVar2 + uVar1;
  }
  ChangeInteger(ofs,uVar3);
  return uVar3;
}

Assistant:

uint32_t WriteBinaryLight(const aiLight* l)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AILIGHT);

	len += Write<aiString>(l->mName);
	len += Write<unsigned int>(l->mType);

	if (l->mType != aiLightSource_DIRECTIONAL) { 
		len += Write<float>(l->mAttenuationConstant);
		len += Write<float>(l->mAttenuationLinear);
		len += Write<float>(l->mAttenuationQuadratic);
	}

	len += Write<aiColor3D>(l->mColorDiffuse);
	len += Write<aiColor3D>(l->mColorSpecular);
	len += Write<aiColor3D>(l->mColorAmbient);

	if (l->mType == aiLightSource_SPOT) {
		len += Write<float>(l->mAngleInnerCone);
		len += Write<float>(l->mAngleOuterCone);
	}

	ChangeInteger(old,len);
	return len;
}